

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rfid(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x20000) != 0) {
      gen_io_start(tcg_ctx_00);
    }
    gen_update_cfar(ctx,(ctx->base).pc_next - 4);
    gen_helper_rfid(tcg_ctx_00,tcg_ctx_00->cpu_env);
    gen_sync_exception(ctx);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_rfid(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Restore CPU state */
    CHK_SV;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_helper_rfid(tcg_ctx, tcg_ctx->cpu_env);
    gen_sync_exception(ctx);
}